

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::processInitRequest(CommonCore *this,ActionMessage *cmd)

{
  BaseTimeCoordinator *pBVar1;
  bool bVar2;
  FederateStates FVar3;
  uint uVar4;
  int iVar5;
  FederateState *pFVar6;
  FedInfo **ppFVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  FedInfo **ppFVar11;
  FedInfo *pFVar12;
  FedInfo **ppFVar13;
  
  if (cmd->messageAction == cmd_init_grant) {
    if ((cmd->flags & 1) == 0) {
      bVar2 = BrokerBase::transitionBrokerState(&this->super_BrokerBase,INITIALIZING,OPERATING);
      if (bVar2) {
        if (this->filterFed != (FilterFederate *)0x0) {
          FilterFederate::organizeFilterOperations(this->filterFed);
        }
        if ((this->loopFederates).dataStorage.csize == 0) {
          uVar4 = (this->loopFederates).dataStorage.bsize;
          ppFVar7 = (this->loopFederates).dataStorage.dataptr;
          if ((long)(int)uVar4 == 0x20) {
            lVar8 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
            if (ppFVar7 == (FedInfo **)0x0) {
              ppFVar13 = (FedInfo **)
                         &gmlc::containers::
                          StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::
                          end()::emptyValue;
            }
            else {
              ppFVar13 = ppFVar7 + lVar8 + 1;
            }
            pFVar12 = *ppFVar13;
            uVar4 = 0;
            uVar9 = 0x20;
          }
          else {
            lVar8 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
            ppFVar13 = ppFVar7 + lVar8;
            pFVar12 = *ppFVar13 + (int)uVar4;
            uVar9 = uVar4;
          }
        }
        else {
          ppFVar7 = (this->loopFederates).dataStorage.dataptr;
          pFVar12 = *ppFVar7;
          lVar8 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
          uVar4 = 0;
          ppFVar13 = ppFVar7;
          uVar9 = (this->loopFederates).dataStorage.bsize;
        }
        if (ppFVar7 == (FedInfo **)0x0) {
          ppFVar11 = (FedInfo **)
                     &gmlc::containers::
                      StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                      emptyValue;
        }
        else {
          ppFVar11 = ppFVar7 + lVar8 + 1;
        }
        uVar10 = 0;
        if (uVar9 != 0x20) {
          ppFVar11 = ppFVar7 + lVar8;
          uVar10 = uVar9;
        }
        while ((uVar4 != uVar10 || (ppFVar13 != ppFVar11))) {
          FederateState::addAction(pFVar12->fed,cmd);
          if ((int)uVar4 < 0x1f) {
            pFVar12 = pFVar12 + 1;
            uVar4 = uVar4 + 1;
          }
          else {
            ppFVar13 = ppFVar13 + (ulong)(uVar4 - 0x1f >> 5) + 1;
            uVar4 = uVar4 + 1 & 0x1f;
            pFVar12 = (FedInfo *)((long)&(*ppFVar13)->fed + (ulong)(uVar4 << 4));
          }
        }
        if ((this->filterFed != (FilterFederate *)0x0) &&
           ((this->filterTiming != false || ((this->super_BrokerBase).globalTime == true)))) {
          FilterFederate::handleMessage(this->filterFed,cmd);
        }
        if (this->translatorFed != (TranslatorFederate *)0x0) {
          TranslatorFederate::handleMessage(this->translatorFed,cmd);
        }
        pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar1->_vptr_BaseTimeCoordinator[10])(pBVar1,0);
        pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        iVar5 = (*pBVar1->_vptr_BaseTimeCoordinator[9])(pBVar1,0x8831d580);
        if ((char)iVar5 == '\0') {
          (this->super_BrokerBase).enteredExecutionMode = true;
        }
        bVar2 = BaseTimeCoordinator::hasActiveTimeDependencies
                          ((this->super_BrokerBase).timeCoord._M_t.
                           super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                           .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl
                          );
        if (!bVar2) {
          BaseTimeCoordinator::disconnect
                    ((this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
          return;
        }
      }
      else if ((cmd->flags & 0x300) != 0) {
        if ((this->loopFederates).dataStorage.csize == 0) {
          uVar4 = (this->loopFederates).dataStorage.bsize;
          ppFVar7 = (this->loopFederates).dataStorage.dataptr;
          if ((long)(int)uVar4 == 0x20) {
            lVar8 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
            if (ppFVar7 == (FedInfo **)0x0) {
              ppFVar13 = (FedInfo **)
                         &gmlc::containers::
                          StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::
                          end()::emptyValue;
            }
            else {
              ppFVar13 = ppFVar7 + lVar8 + 1;
            }
            pFVar12 = *ppFVar13;
            uVar4 = 0;
            uVar9 = 0x20;
          }
          else {
            lVar8 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
            ppFVar13 = ppFVar7 + lVar8;
            pFVar12 = *ppFVar13 + (int)uVar4;
            uVar9 = uVar4;
          }
        }
        else {
          ppFVar7 = (this->loopFederates).dataStorage.dataptr;
          pFVar12 = *ppFVar7;
          lVar8 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
          uVar4 = 0;
          ppFVar13 = ppFVar7;
          uVar9 = (this->loopFederates).dataStorage.bsize;
        }
        if (ppFVar7 == (FedInfo **)0x0) {
          ppFVar11 = (FedInfo **)
                     &gmlc::containers::
                      StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                      emptyValue;
        }
        else {
          ppFVar11 = ppFVar7 + lVar8 + 1;
        }
        uVar10 = 0;
        if (uVar9 != 0x20) {
          ppFVar11 = ppFVar7 + lVar8;
          uVar10 = uVar9;
        }
        while ((uVar4 != uVar10 || (ppFVar13 != ppFVar11))) {
          FVar3 = FederateState::getState(pFVar12->fed);
          if (FVar3 == CREATED) {
            FederateState::addAction(pFVar12->fed,cmd);
          }
          if ((int)uVar4 < 0x1f) {
            pFVar12 = pFVar12 + 1;
            uVar4 = uVar4 + 1;
          }
          else {
            ppFVar13 = ppFVar13 + (ulong)(uVar4 - 0x1f >> 5) + 1;
            uVar4 = uVar4 + 1 & 0x1f;
            pFVar12 = (FedInfo *)((long)&(*ppFVar13)->fed + (ulong)(uVar4 << 4));
          }
        }
      }
    }
    else if (((this->initIterations)._M_base._M_i & 1U) != 0) {
      LOCK();
      (this->initIterations)._M_base._M_i = false;
      UNLOCK();
      bVar2 = BrokerBase::transitionBrokerState(&this->super_BrokerBase,INITIALIZING,CONNECTED);
      if (bVar2) {
        if ((this->loopFederates).dataStorage.csize == 0) {
          uVar4 = (this->loopFederates).dataStorage.bsize;
          ppFVar7 = (this->loopFederates).dataStorage.dataptr;
          if ((long)(int)uVar4 == 0x20) {
            lVar8 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
            if (ppFVar7 == (FedInfo **)0x0) {
              ppFVar13 = (FedInfo **)
                         &gmlc::containers::
                          StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::
                          end()::emptyValue;
            }
            else {
              ppFVar13 = ppFVar7 + lVar8 + 1;
            }
            pFVar12 = *ppFVar13;
            uVar4 = 0;
            uVar9 = 0x20;
          }
          else {
            lVar8 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
            ppFVar13 = ppFVar7 + lVar8;
            pFVar12 = *ppFVar13 + (int)uVar4;
            uVar9 = uVar4;
          }
        }
        else {
          ppFVar7 = (this->loopFederates).dataStorage.dataptr;
          pFVar12 = *ppFVar7;
          lVar8 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
          uVar4 = 0;
          ppFVar13 = ppFVar7;
          uVar9 = (this->loopFederates).dataStorage.bsize;
        }
        if (ppFVar7 == (FedInfo **)0x0) {
          ppFVar11 = (FedInfo **)
                     &gmlc::containers::
                      StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                      emptyValue;
        }
        else {
          ppFVar11 = ppFVar7 + lVar8 + 1;
        }
        uVar10 = 0;
        if (uVar9 != 0x20) {
          ppFVar11 = ppFVar7 + lVar8;
          uVar10 = uVar9;
        }
        while ((uVar4 != uVar10 || (ppFVar13 != ppFVar11))) {
          if (((pFVar12->fed->initIterating)._M_base._M_i & 1U) != 0) {
            LOCK();
            (pFVar12->fed->initIterating)._M_base._M_i = false;
            UNLOCK();
            LOCK();
            (pFVar12->fed->init_transmitted)._M_base._M_i = false;
            UNLOCK();
            FederateState::addAction(pFVar12->fed,cmd);
          }
          if ((int)uVar4 < 0x1f) {
            pFVar12 = pFVar12 + 1;
            uVar4 = uVar4 + 1;
          }
          else {
            ppFVar13 = ppFVar13 + (ulong)(uVar4 - 0x1f >> 5) + 1;
            uVar4 = uVar4 + 1 & 0x1f;
            pFVar12 = (FedInfo *)((long)&(*ppFVar13)->fed + (ulong)(uVar4 << 4));
          }
        }
      }
      else if ((cmd->flags & 0x300) != 0) {
        routeMessage(this,cmd);
        return;
      }
    }
  }
  else if ((cmd->messageAction == cmd_init) &&
          (pFVar6 = getFederateCore(this,(GlobalFederateId)(cmd->source_id).gid),
          pFVar6 != (FederateState *)0x0)) {
    LOCK();
    (pFVar6->init_transmitted)._M_base._M_i = true;
    UNLOCK();
    bVar2 = allInitReady(this);
    if (bVar2) {
      bVar2 = BrokerBase::transitionBrokerState(&this->super_BrokerBase,CONNECTED,INITIALIZING);
      if (bVar2) {
        if (((this->initIterations)._M_base._M_i & 1U) == 0) {
          checkDependencies(this);
        }
        else {
          *(byte *)&cmd->flags = (byte)cmd->flags | 1;
        }
      }
      else {
        uVar4._0_1_ = (this->super_BrokerBase).observer;
        uVar4._1_1_ = (this->super_BrokerBase).globalTime;
        uVar4._2_1_ = (this->super_BrokerBase).asyncTime;
        uVar4._3_1_ = (this->super_BrokerBase).dynamicFederation;
        if (((cmd->flags >> (uVar4 & 0x1f) & 1) == 0) &&
           ((this->super_BrokerBase).dynamicFederation != true)) {
          return;
        }
      }
      (cmd->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
      (*(this->super_Core)._vptr_Core[0x6b])(this,0,cmd);
      return;
    }
  }
  return;
}

Assistant:

void CommonCore::processInitRequest(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_INIT: {
            auto* fed = getFederateCore(cmd.source_id);
            if (fed == nullptr) {
                break;
            }

            fed->init_transmitted = true;

            if (allInitReady()) {
                if (transitionBrokerState(BrokerState::CONNECTED,
                                          BrokerState::INITIALIZING)) {  // make sure we only
                    // do this once
                    if (initIterations) {
                        setActionFlag(cmd, iteration_requested_flag);
                    } else {
                        checkDependencies();
                    }
                    cmd.source_id = global_broker_id_local;
                    transmit(parent_route_id, cmd);
                } else if (checkActionFlag(cmd, observer) || dynamicFederation) {
                    cmd.source_id = global_broker_id_local;
                    transmit(parent_route_id, cmd);
                }
            }

        } break;
        case CMD_INIT_GRANT:
            if (checkActionFlag(cmd, iteration_requested_flag)) {
                if (initIterations) {
                    initIterations.store(false);
                    if (transitionBrokerState(BrokerState::INITIALIZING, BrokerState::CONNECTED)) {
                        loopFederates.apply([&cmd](auto& fed) {
                            if (fed->initIterating.load()) {
                                fed->initIterating.store(false);
                                fed->init_transmitted = false;
                                fed->addAction(cmd);
                            }
                        });
                    } else if (checkActionFlag(cmd, observer_flag) ||
                               checkActionFlag(cmd, dynamic_join_flag)) {
                        routeMessage(cmd);
                    }
                }
            } else {
                if (transitionBrokerState(
                        BrokerState::INITIALIZING,
                        BrokerState::OPERATING)) {  // forward the grant to all federates
                    if (filterFed != nullptr) {
                        filterFed->organizeFilterOperations();
                    }

                    loopFederates.apply([&cmd](auto& fed) { fed->addAction(cmd); });
                    if (filterFed != nullptr && (filterTiming || globalTime)) {
                        filterFed->handleMessage(cmd);
                    }
                    if (translatorFed != nullptr) {
                        translatorFed->handleMessage(cmd);
                    }
                    timeCoord->enteringExecMode();
                    auto res = timeCoord->checkExecEntry();
                    if (res == MessageProcessingResult::NEXT_STEP) {
                        enteredExecutionMode = true;
                    }
                    if (!timeCoord->hasActiveTimeDependencies()) {
                        timeCoord->disconnect();
                    }
                } else if (checkActionFlag(cmd, observer_flag) ||
                           checkActionFlag(cmd, dynamic_join_flag)) {
                    loopFederates.apply([&cmd](auto& fed) {
                        if (fed->getState() == FederateStates::CREATED) {
                            fed->addAction(cmd);
                        }
                    });
                }
            }

            break;
        default:
            break;
    }
}